

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

quad_value_bit_vector * __thiscall
bsim::quad_value_bit_vector::operator=(quad_value_bit_vector *this,quad_value_bit_vector *other)

{
  long lVar1;
  
  if (other != this) {
    std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
              (&this->bits,
               (long)(other->bits).
                     super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(other->bits).
                     super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl
                     .super__Vector_impl_data._M_start);
    this->N = other->N;
    if (0 < other->N) {
      lVar1 = 0;
      do {
        (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl
        .super__Vector_impl_data._M_start[lVar1].value =
             (other->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar1].value;
        lVar1 = lVar1 + 1;
      } while (lVar1 < other->N);
    }
  }
  return this;
}

Assistant:

quad_value_bit_vector& operator=(const quad_value_bit_vector& other) {
      if (&other == this) {
    	return *this;
      }

      bits.resize(other.bits.size());

      N = other.bitLength();

      for (int i = 0; i < other.bitLength(); i++) {
        bits[i] = other.bits[i];
      }

      return *this;
    }